

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O2

void __thiscall
LottieParserImpl::LottieParserImpl
          (LottieParserImpl *this,char *str,string *dir_path,ColorFilter *filter)

{
  LookaheadParserHandler::LookaheadParserHandler(&this->super_LookaheadParserHandler,str);
  std::function<void_(float_&,_float_&,_float_&)>::function(&this->mColorFilter,filter);
  (this->mPathInfo).mResult.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPathInfo).mResult.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPathInfo).mVertices.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPathInfo).mResult.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPathInfo).mVertices.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPathInfo).mVertices.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPathInfo).mOutPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPathInfo).mOutPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPathInfo).mInPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mPathInfo).mOutPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPathInfo).mInPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mPathInfo).mInPoint.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPathInfo).mClosed = false;
  (this->mInterpolatorCache)._M_h._M_buckets = &(this->mInterpolatorCache)._M_h._M_single_bucket;
  (this->mInterpolatorCache)._M_h._M_bucket_count = 1;
  (this->mInterpolatorCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mInterpolatorCache)._M_h._M_element_count = 0;
  (this->mInterpolatorCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mInterpolatorCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mInterpolatorCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mComposition).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mComposition).
  super___shared_ptr<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mLayersToUpdate).
  super__Vector_base<rlottie::internal::model::Layer_*,_std::allocator<rlottie::internal::model::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->compRef = (Composition *)0x0;
  this->curLayerRef = (Layer *)0x0;
  (this->mLayersToUpdate).
  super__Vector_base<rlottie::internal::model::Layer_*,_std::allocator<rlottie::internal::model::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mLayersToUpdate).
  super__Vector_base<rlottie::internal::model::Layer_*,_std::allocator<rlottie::internal::model::Layer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->mDirPath,(string *)dir_path);
  return;
}

Assistant:

LottieParserImpl(char *str, std::string dir_path, model::ColorFilter filter)
        : LookaheadParserHandler(str),
          mColorFilter(std::move(filter)),
          mDirPath(std::move(dir_path))
    {
    }